

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rrRenderer.cpp
# Opt level: O1

ClipVec4 * __thiscall
rr::anon_unknown_19::cliputil::ComponentPlane<1,_1>::getLineIntersectionPoint
          (ClipVec4 *__return_storage_ptr__,ComponentPlane<1,_1> *this,ClipVec4 *v0,ClipVec4 *v1)

{
  double dVar1;
  int i;
  long lVar2;
  Vector<double,_4> *res_2;
  double dVar3;
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  double dVar4;
  double dVar5;
  double dVar6;
  ClipVec4 clippedV1;
  ClipVec4 clippedV0;
  double local_58 [9];
  
  dVar3 = v0->m_data[1];
  dVar1 = v0->m_data[3];
  dVar4 = v1->m_data[1] - dVar3;
  dVar5 = v1->m_data[3] - dVar1;
  dVar6 = (dVar1 - dVar3) / (dVar4 - dVar5);
  local_58[6] = 0.0;
  local_58[7] = 0.0;
  local_58[4] = 0.0;
  local_58[5] = 0.0;
  lVar2 = 0;
  do {
    local_58[lVar2 + 4] = v0->m_data[lVar2] * (1.0 - dVar6) + v1->m_data[lVar2] * dVar6;
    lVar2 = lVar2 + 1;
  } while (lVar2 != 4);
  dVar3 = (-dVar1 - dVar3) / (dVar4 + dVar5);
  local_58[2] = 0.0;
  local_58[3] = 0.0;
  local_58[0] = 0.0;
  local_58[1] = 0.0;
  lVar2 = 0;
  do {
    local_58[lVar2] = v0->m_data[lVar2] * (1.0 - dVar3) + v1->m_data[lVar2] * dVar3;
    lVar2 = lVar2 + 1;
  } while (lVar2 != 4);
  (*(this->super_ClipVolumePlane)._vptr_ClipVolumePlane[1])(this,local_58 + 4,local_58);
  if (extraout_XMM0_Qa <= 0.5) {
    __return_storage_ptr__->m_data[2] = 0.0;
    __return_storage_ptr__->m_data[3] = 0.0;
    __return_storage_ptr__->m_data[0] = 0.0;
    __return_storage_ptr__->m_data[1] = 0.0;
    lVar2 = 0;
    do {
      __return_storage_ptr__->m_data[lVar2] =
           local_58[lVar2 + 4] * (1.0 - extraout_XMM0_Qa) + local_58[lVar2] * extraout_XMM0_Qa;
      lVar2 = lVar2 + 1;
    } while (lVar2 != 4);
  }
  else {
    (*(this->super_ClipVolumePlane)._vptr_ClipVolumePlane[1])(this,local_58,local_58 + 4);
    __return_storage_ptr__->m_data[0] = 0.0;
    __return_storage_ptr__->m_data[1] = 0.0;
    __return_storage_ptr__->m_data[2] = 0.0;
    __return_storage_ptr__->m_data[3] = 0.0;
    lVar2 = 0;
    do {
      __return_storage_ptr__->m_data[lVar2] =
           local_58[lVar2] * (1.0 - extraout_XMM0_Qa_00) + local_58[lVar2 + 4] * extraout_XMM0_Qa_00
      ;
      lVar2 = lVar2 + 1;
    } while (lVar2 != 4);
  }
  return __return_storage_ptr__;
}

Assistant:

ClipVec4 ComponentPlane<Sign, CompNdx>::getLineIntersectionPoint (const ClipVec4& v0, const ClipVec4& v1) const
{
	// A point on line might be far away, causing clipping ratio (clipLineSegmentEnd) to become extremely close to 1.0
	// even if the another point is not on the plane. Prevent clipping ratio from saturating by using points on line
	// that are (nearly) on this and (nearly) on the opposite plane.

	const ClipVec4	clippedV0	= tcu::mix(v0, v1, ComponentPlane<+1, CompNdx>().clipLineSegmentEnd(v0, v1));
	const ClipVec4	clippedV1	= tcu::mix(v0, v1, ComponentPlane<-1, CompNdx>().clipLineSegmentEnd(v0, v1));
	const ClipFloat	clipRatio	= clipLineSegmentEnd(clippedV0, clippedV1);

	// Find intersection point of line from v0 to v1 and the current plane. Avoid ratios near 1.0
	if (clipRatio <= (ClipFloat)0.5)
		return tcu::mix(clippedV0, clippedV1, clipRatio);
	else
	{
		const ClipFloat complementClipRatio = clipLineSegmentEnd(clippedV1, clippedV0);
		return tcu::mix(clippedV1, clippedV0, complementClipRatio);
	}
}